

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,HttpHeaderTable *responseHeaderTable,AsyncIoStream *stream,
                 HttpClientSettings *settings)

{
  HttpClientSettings *params_2;
  HttpClient *extraout_RDX;
  Own<kj::HttpClient,_std::nullptr_t> OVar1;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_48;
  HttpClientSettings *local_28;
  HttpClientSettings *settings_local;
  AsyncIoStream *stream_local;
  HttpHeaderTable *responseHeaderTable_local;
  
  local_28 = settings;
  settings_local = (HttpClientSettings *)stream;
  stream_local = (AsyncIoStream *)responseHeaderTable;
  responseHeaderTable_local = (HttpHeaderTable *)this;
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own(&local_48,stream,(Disposer *)&NullDisposer::instance);
  params_2 = mv<kj::HttpClientSettings>(settings);
  heap<kj::(anonymous_namespace)::HttpClientImpl,kj::HttpHeaderTable_const&,kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::HttpClientSettings>
            ((kj *)&stack0xffffffffffffffc8,responseHeaderTable,&local_48,params_2);
  Own<kj::HttpClient,decltype(nullptr)>::Own<kj::(anonymous_namespace)::HttpClientImpl,void>
            ((Own<kj::HttpClient,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)
             &stack0xffffffffffffffc8);
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)
             &stack0xffffffffffffffc8);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own(&local_48);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<HttpClient> newHttpClient(
    const HttpHeaderTable& responseHeaderTable, kj::AsyncIoStream& stream,
    HttpClientSettings settings) {
  return kj::heap<HttpClientImpl>(responseHeaderTable,
      kj::Own<kj::AsyncIoStream>(&stream, kj::NullDisposer::instance),
      kj::mv(settings));
}